

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O2

vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_> *
__thiscall
adios2::core::engine::ssc::SscReaderGeneric::BlocksInfo
          (vector<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
           *__return_storage_ptr__,SscReaderGeneric *this,Variable<int> *variable,size_t step)

{
  BlocksInfoCommon<int>(__return_storage_ptr__,this,variable,step);
  return __return_storage_ptr__;
}

Assistant:

void SscReaderGeneric::GetDeferredDeltaCommon(VariableBase &variable, void *data)
{

    Dims vStart = variable.m_Start;
    Dims vCount = variable.m_Count;
    Dims vShape = variable.m_Shape;
    Dims vMemStart = variable.m_MemoryStart;
    Dims vMemCount = variable.m_MemoryCount;

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vShape.begin(), vShape.end());
        std::reverse(vMemStart.begin(), vMemStart.end());
        std::reverse(vMemCount.begin(), vMemCount.end());
    }

    m_LocalReadPattern.emplace_back();
    auto &b = m_LocalReadPattern.back();
    b.name = variable.m_Name;
    b.type = variable.m_Type;
    b.elementSize = variable.m_ElementSize;
    b.shapeId = variable.m_ShapeID;
    b.start = vStart;
    b.count = vCount;
    b.shape = vShape;
    b.memStart = vMemStart;
    b.memCount = vMemCount;
    b.bufferStart = 0;
    b.bufferCount = 0;
    b.data = data;
    b.performed = false;

    for (const auto &d : b.count)
    {
        if (d == 0)
        {
            helper::Throw<std::invalid_argument>("Engine", "SscReader", "GetDeferredDeltaCommon",
                                                 "SetSelection count dimensions cannot be 0");
        }
    }
}